

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ack_message_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::AckMessageTest_TestEncodeV1_Test::TestBody
          (AckMessageTest_TestEncodeV1_Test *this)

{
  bool bVar1;
  uint32_t in_ECX;
  char *message;
  AssertionResult gtest_ar;
  ByteBuffer buffer;
  AssertHelper local_70;
  string local_68;
  internal local_48 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  HexEncoderDecoder local_38 [48];
  
  bidfx_public_api::price::pixie::AckMessage::Encode((int)local_38);
  tools::HexEncoderDecoder::StreamAsHex_abi_cxx11_(&local_68,local_38,(ByteBuffer *)0x16,in_ECX);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_48,"kEncodedMessageV1","HexEncoderDecoder::StreamAsHex(buffer, 22)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &kEncodedMessageV1_abi_cxx11_,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/ack_message_test.cpp"
               ,0x2e,message);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((long *)local_68._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_68._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_68._M_dataplus._M_p + 8))();
      }
      local_68._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)local_38);
  return;
}

Assistant:

TEST(AckMessageTest, TestEncodeV1)
{
    ByteBuffer buffer = ackMessage.Encode(1);
    ASSERT_EQ(kEncodedMessageV1, HexEncoderDecoder::StreamAsHex(buffer, 22));
}